

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O2

void recff_ffi_fill(jit_State *J,RecordFFData *rd)

{
  TRef sp;
  uint uVar1;
  TRef *pTVar2;
  cTValue *sval;
  CType *pCVar3;
  IRRef1 IVar4;
  TRef TVar5;
  TRef TVar6;
  uint uVar7;
  IROpT IVar8;
  int iVar9;
  ulong uVar10;
  int32_t k;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  int *piVar14;
  uint uVar15;
  IRRef1 IVar16;
  CTState *cts;
  long lVar17;
  CTSize sz;
  int local_134 [65];
  
  pTVar2 = J->base;
  TVar5 = *pTVar2;
  TVar6 = pTVar2[1];
  if (TVar6 == 0 || TVar5 == 0) {
    return;
  }
  cts = (CTState *)(ulong)J[-1].bpropcache[9].mode;
  sp = pTVar2[2];
  sval = rd->argv;
  pCVar3 = cts->tab;
  if ((sval->field_2).it == 0xfffffff5) {
    uVar11 = (ulong)*(ushort *)((ulong)(sval->u32).lo + 6);
    uVar12 = uVar11 * 0x10;
    uVar7 = pCVar3[uVar11].info;
    if ((uVar7 & 0xf0000000) == 0x20000000) {
      uVar12 = (ulong)((uVar7 & 0xffff) << 4);
    }
    lj_ctype_info(cts,(CTypeID)(uVar12 >> 4),&sz);
  }
  TVar5 = crec_ct_tv(J,pCVar3 + 0x11,0,TVar5,sval);
  TVar6 = crec_toint(J,cts,TVar6,rd->argv + 1);
  if (sp == 0) {
    uVar7 = lj_ir_kint(J,0);
  }
  else {
    uVar7 = crec_toint(J,cts,sp,rd->argv + 2);
  }
  uVar11 = (ulong)uVar7;
  rd->nres = 0;
  if (-1 < (short)TVar6) {
    uVar1 = (J->cur).ir[TVar6 & 0x7fff].field_1.op12;
    if (uVar1 == 0) {
      return;
    }
    if (uVar1 < 0x81) {
      iVar9 = 0x16;
      uVar13 = 0;
      uVar12 = 8;
      uVar10 = 0;
      do {
        uVar10 = uVar10 & 0xffffffff;
        piVar14 = local_134 + uVar10 * 4;
        while (uVar15 = uVar13 + (int)uVar12, uVar15 <= uVar1) {
          if (0xf < uVar10) goto LAB_0012c87b;
          piVar14[-1] = uVar13;
          *piVar14 = iVar9;
          uVar10 = uVar10 + 1;
          piVar14 = piVar14 + 4;
          uVar13 = uVar15;
        }
        uVar12 = uVar12 >> 1;
        iVar9 = iVar9 + -2;
      } while (uVar13 < uVar1);
      if (uVar10 != 0) {
        if (local_134[0] != 0x10 || -1 < (short)(IRRef1)uVar7) {
          (J->fold).ins.field_0.op1 = (IRRef1)uVar7;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x55130270;
          TVar6 = lj_opt_fold(J);
          uVar11 = (ulong)TVar6;
          IVar16 = (IRRef1)TVar6;
          if (local_134[0] != 0x10) {
            if (local_134[0] == 0x16) {
              if (-1 < (short)IVar16) {
                (J->fold).ins.field_0.op1 = IVar16;
                *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x551602d4;
                TVar6 = lj_opt_fold(J);
                IVar16 = (IRRef1)TVar6;
              }
              TVar6 = lj_ir_kint64(J,0x101010101010101);
              IVar4 = (IRRef1)TVar6;
              IVar8 = 0x2a16;
            }
            else {
              k = 0x1010101;
              if (local_134[0] == 0x12) {
                k = 0x101;
              }
              TVar6 = lj_ir_kint(J,k);
              IVar4 = (IRRef1)TVar6;
              IVar8 = 0x2a13;
            }
            (J->fold).ins.field_0.ot = IVar8;
            (J->fold).ins.field_0.op1 = IVar16;
            (J->fold).ins.field_0.op2 = IVar4;
            TVar6 = lj_opt_fold(J);
            uVar11 = (ulong)TVar6;
          }
        }
        for (lVar17 = 0; (uVar10 & 0xffffffff) << 4 != lVar17; lVar17 = lVar17 + 0x10) {
          TVar6 = lj_ir_kint64(J,(ulong)*(uint *)((long)local_134 + lVar17 + -4));
          (J->fold).ins.field_0.ot = 0x2809;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
          TVar6 = lj_opt_fold(J);
          (J->fold).ins.field_0.ot = (ushort)*(undefined4 *)((long)local_134 + lVar17) | 0x4b00;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
          (J->fold).ins.field_0.op2 = (IRRef1)uVar11;
          lj_opt_fold(J);
        }
        goto LAB_0012c890;
      }
    }
  }
LAB_0012c87b:
  lj_ir_call(J,IRCALL_memset,(ulong)TVar5,uVar11,(ulong)TVar6);
LAB_0012c890:
  (J->fold).ins.field_0.ot = 0x5400;
  (J->fold).ins.field_1.op12 = 0;
  lj_opt_fold(J);
  return;
}

Assistant:

void LJ_FASTCALL recff_ffi_fill(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  TRef trdst = J->base[0], trlen = J->base[1], trfill = J->base[2];
  if (trdst && trlen) {
    CTSize step = 1;
    if (tviscdata(&rd->argv[0])) {  /* Get alignment of original destination. */
      CTSize sz;
      CType *ct = ctype_raw(cts, cdataV(&rd->argv[0])->ctypeid);
      if (ctype_isptr(ct->info))
	ct = ctype_rawchild(cts, ct);
      step = (1u<<ctype_align(lj_ctype_info(cts, ctype_typeid(cts, ct), &sz)));
    }
    trdst = crec_ct_tv(J, ctype_get(cts, CTID_P_VOID), 0, trdst, &rd->argv[0]);
    trlen = crec_toint(J, cts, trlen, &rd->argv[1]);
    if (trfill)
      trfill = crec_toint(J, cts, trfill, &rd->argv[2]);
    else
      trfill = lj_ir_kint(J, 0);
    rd->nres = 0;
    crec_fill(J, trdst, trlen, trfill, step);
  }  /* else: interpreter will throw. */
}